

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O0

bool __thiscall xmrig::Url::parseIPv6(Url *this,char *addr)

{
  char *__s;
  char *pcVar1;
  String *pSVar2;
  void *__s_00;
  long lVar3;
  char *in_RSI;
  long in_RDI;
  char *host;
  size_t size;
  char *port;
  char *end;
  char *in_stack_ffffffffffffffa8;
  String *this_00;
  bool local_1;
  
  __s = strchr(in_RSI,0x5d);
  if (__s == (char *)0x0) {
    local_1 = false;
  }
  else {
    pcVar1 = strchr(__s,0x3a);
    if (pcVar1 == (char *)0x0) {
      local_1 = false;
    }
    else {
      pSVar2 = (String *)(__s + -(long)in_RSI);
      this_00 = pSVar2;
      __s_00 = operator_new__((ulong)pSVar2);
      memset(__s_00,0,(size_t)this_00);
      memcpy(__s_00,in_RSI + 1,(size_t)((long)&pSVar2[-1].m_size + 7));
      String::operator=(this_00,in_stack_ffffffffffffffa8);
      lVar3 = strtol(pcVar1 + 1,(char **)0x0,10);
      *(short *)(in_RDI + 0x28) = (short)lVar3;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool xmrig::Url::parseIPv6(const char *addr)
{
    const char *end = strchr(addr, ']');
    if (!end) {
        return false;
    }

    const char *port = strchr(end, ':');
    if (!port) {
        return false;
    }

    const auto size = static_cast<size_t>(end - addr);
    char *host        = new char[size]();
    memcpy(host, addr + 1, size - 1);

    m_host = host;
    m_port = static_cast<uint16_t>(strtol(port + 1, nullptr, 10));

    return true;
}